

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O3

Index __thiscall
wabt::interp::FreeList<wabt::interp::Object*>::New<wabt::interp::Table*>
          (FreeList<wabt::interp::Object*> *this,Table **args)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  Table *local_10;
  
  lVar3 = *(long *)(this + 0x18);
  if (lVar3 == 0) {
    local_10 = *args;
    std::vector<wabt::interp::Object*,std::allocator<wabt::interp::Object*>>::
    emplace_back<wabt::interp::Object*>
              ((vector<wabt::interp::Object*,std::allocator<wabt::interp::Object*>> *)this,
               (Object **)&local_10);
    lVar3 = *(long *)(this + 8) - *(long *)this >> 3;
  }
  else {
    uVar1 = *(ulong *)(*(long *)this + -8 + lVar3 * 8);
    if ((uVar1 & 1) == 0) {
      __assert_fail("!IsUsed(index)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/interp/interp-inl.h"
                    ,0xcb,
                    "Index wabt::interp::FreeList<wabt::interp::Object *>::New(Args &&...) [T = wabt::interp::Object *, Args = <wabt::interp::Table *>]"
                   );
    }
    lVar2 = *(long *)(this + 0x20);
    if (lVar2 == 0) {
      __assert_fail("free_items_ > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/interp/interp-inl.h"
                    ,0xcc,
                    "Index wabt::interp::FreeList<wabt::interp::Object *>::New(Args &&...) [T = wabt::interp::Object *, Args = <wabt::interp::Table *>]"
                   );
    }
    *(ulong *)(this + 0x18) = uVar1 >> 1;
    *(Table **)(*(long *)this + -8 + lVar3 * 8) = *args;
    *(long *)(this + 0x20) = lVar2 + -1;
  }
  return lVar3 - 1;
}

Assistant:

auto FreeList<T>::New(Args&&... args) -> Index {
  if (free_head_ == 0) {
    list_.push_back(T(std::forward<Args>(args)...));
    return list_.size() - 1;
  }

  Index index = free_head_ - 1;

  assert(!IsUsed(index));
  assert(free_items_ > 0);

  free_head_ = reinterpret_cast<uintptr_t>(list_[index]) >> ptrFreeShift;
  list_[index] = T(std::forward<Args>(args)...);
  free_items_--;
  return index;
}